

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-cave.c
# Opt level: O0

connector *
transform_join_list(connector *join,wchar_t nrow,wchar_t ncol,wchar_t y0,wchar_t x0,wchar_t rotate,
                   _Bool reflect)

{
  wchar_t wVar1;
  connector *pcVar2;
  wchar_t local_58;
  wchar_t temp_1;
  wchar_t rwidth;
  wchar_t rheight;
  loc g;
  wchar_t temp;
  wchar_t i;
  wchar_t ntrow;
  wchar_t ntcol;
  connector **next_link;
  connector *result;
  wchar_t wStack_20;
  _Bool reflect_local;
  wchar_t rotate_local;
  wchar_t x0_local;
  wchar_t y0_local;
  wchar_t ncol_local;
  wchar_t nrow_local;
  connector *join_local;
  
  result._3_1_ = reflect;
  next_link = (connector **)0x0;
  _ntrow = (connector **)&next_link;
  for (g.y = 0; result._4_4_ = rotate, wStack_20 = x0, rotate_local = y0, x0_local = ncol,
      y0_local = nrow, _ncol_local = join, g.y < rotate % 4; g.y = g.y + 1) {
  }
  for (; _ncol_local != (connector *)0x0; _ncol_local = _ncol_local->next) {
    _rwidth = loc((_ncol_local->grid).x - wStack_20,(_ncol_local->grid).y - rotate_local);
    temp_1 = y0_local;
    local_58 = x0_local;
    if ((((-1 < (long)_rwidth) && (rheight < y0_local)) && (L'\xffffffff' < rwidth)) &&
       (rwidth < x0_local)) {
      if ((result._3_1_ & 1) != 0) {
        rwidth = (x0_local + L'\xffffffff') - rwidth;
      }
      for (g.y = 0; g.y < result._4_4_ % 4; g.y = g.y + 1) {
        wVar1 = rheight;
        rheight = (local_58 + L'\xffffffff') - rwidth;
        rwidth = wVar1;
        wVar1 = temp_1;
        temp_1 = local_58;
        local_58 = wVar1;
      }
      pcVar2 = (connector *)mem_zalloc(0x20);
      *_ntrow = pcVar2;
      (*_ntrow)->grid = (loc_conflict)_rwidth;
      (*_ntrow)->feat = _ncol_local->feat;
      _ntrow = &(*_ntrow)->next;
    }
  }
  return (connector *)next_link;
}

Assistant:

static struct connector *transform_join_list(const struct connector *join,
		int nrow, int ncol, int y0, int x0, int rotate, bool reflect)
{
	/*
	 * The transformation specified by the arguments is that to map the
	 * chunk to the untransformed coordinates of the connections.  Invert
	 * that to get the transformation to apply to the connections.  Mimic
	 * the logic symmetry_transform().
	 */
	struct connector *result = NULL;
	struct connector **next_link = &result;
	int ntcol, ntrow, i;

	/*
	 * Get the dimensions of the chunk after the forward (chunk to
	 * untransformed connection coordinates) transform.
	 */
	ntrow = nrow;
	ntcol = ncol;
	for (i = 0; i < rotate % 4; ++i) {
		int temp = ntrow;

		ntrow = ntcol;
		ntcol = temp;
	}

	for (; join; join = join->next) {
		/* Undo the translation. */
		struct loc g = loc(join->grid.x - x0, join->grid.y - y0);
		int rheight = nrow, rwidth = ncol;

		/* Only keep the ones that are in bounds for the chunk. */
		if (g.y < 0 || g.y >= nrow || g.x < 0 || g.x >= ncol) continue;

		/* Undo the reflection. */
		if (reflect) {
			g.x = ncol - 1 - g.x;
		}

		/* Undo the rotations. */
		for (i = 0; i < rotate % 4; ++i) {
			int temp = g.y;

			g.y = rwidth - 1 - g.x;
			g.x = temp;
			temp = rwidth;
			rwidth = rheight;
			rheight = temp;
		}

		*next_link = mem_zalloc(sizeof(**next_link));
		(*next_link)->grid = g;
		(*next_link)->feat = join->feat;
		next_link = &((*next_link)->next);
	}

	return result;
}